

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# result.hpp
# Opt level: O1

failure<toml::error_info> *
toml::err<toml::error_info>(failure<toml::error_info> *__return_storage_ptr__,error_info *v)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  value_type local_80;
  
  paVar2 = &local_80.title_.field_2;
  local_80.title_._M_dataplus._M_p = (v->title_)._M_dataplus._M_p;
  paVar1 = &(v->title_).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_80.title_._M_dataplus._M_p == paVar1) {
    local_80.title_.field_2._M_allocated_capacity = paVar1->_M_allocated_capacity;
    local_80.title_.field_2._8_8_ = *(undefined8 *)((long)&(v->title_).field_2 + 8);
    local_80.title_._M_dataplus._M_p = (pointer)paVar2;
  }
  else {
    local_80.title_.field_2._M_allocated_capacity = paVar1->_M_allocated_capacity;
  }
  local_80.title_._M_string_length = (v->title_)._M_string_length;
  paVar3 = &local_80.suffix_.field_2;
  (v->title_)._M_dataplus._M_p = (pointer)paVar1;
  (v->title_)._M_string_length = 0;
  (v->title_).field_2._M_local_buf[0] = '\0';
  local_80.locations_.
  super__Vector_base<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start =
       (v->locations_).
       super__Vector_base<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  local_80.locations_.
  super__Vector_base<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish =
       (v->locations_).
       super__Vector_base<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  local_80.locations_.
  super__Vector_base<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       (v->locations_).
       super__Vector_base<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  (v->locations_).
  super__Vector_base<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (v->locations_).
  super__Vector_base<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (v->locations_).
  super__Vector_base<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_80.suffix_._M_dataplus._M_p = (v->suffix_)._M_dataplus._M_p;
  paVar1 = &(v->suffix_).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_80.suffix_._M_dataplus._M_p == paVar1) {
    local_80.suffix_.field_2._M_allocated_capacity = paVar1->_M_allocated_capacity;
    local_80.suffix_.field_2._8_8_ = *(undefined8 *)((long)&(v->suffix_).field_2 + 8);
    local_80.suffix_._M_dataplus._M_p = (pointer)paVar3;
  }
  else {
    local_80.suffix_.field_2._M_allocated_capacity = paVar1->_M_allocated_capacity;
  }
  local_80.suffix_._M_string_length = (v->suffix_)._M_string_length;
  (v->suffix_)._M_dataplus._M_p = (pointer)paVar1;
  (v->suffix_)._M_string_length = 0;
  (v->suffix_).field_2._M_local_buf[0] = '\0';
  failure<toml::error_info>::failure(__return_storage_ptr__,&local_80);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_80.suffix_._M_dataplus._M_p != paVar3) {
    operator_delete(local_80.suffix_._M_dataplus._M_p,
                    local_80.suffix_.field_2._M_allocated_capacity + 1);
  }
  std::
  vector<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~vector(&local_80.locations_);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_80.title_._M_dataplus._M_p != paVar2) {
    operator_delete(local_80.title_._M_dataplus._M_p,
                    local_80.title_.field_2._M_allocated_capacity + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

failure<typename std::decay<T>::type> err(T&& v)
{
    return failure<typename std::decay<T>::type>(std::forward<T>(v));
}